

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_str * sqlite3_str_new(sqlite3 *db)

{
  long in_RDI;
  sqlite3_str *p;
  sqlite3_uint64 in_stack_ffffffffffffffd8;
  int local_1c;
  sqlite3_str *local_10;
  
  local_10 = (sqlite3_str *)sqlite3_malloc64(in_stack_ffffffffffffffd8);
  if (local_10 == (StrAccum *)0x0) {
    local_10 = &sqlite3OomStr;
  }
  else {
    if (in_RDI == 0) {
      local_1c = 1000000000;
    }
    else {
      local_1c = *(int *)(in_RDI + 0x88);
    }
    sqlite3StrAccumInit(local_10,(sqlite3 *)0x0,(char *)0x0,0,local_1c);
  }
  return local_10;
}

Assistant:

SQLITE_API sqlite3_str *sqlite3_str_new(sqlite3 *db){
  sqlite3_str *p = sqlite3_malloc64(sizeof(*p));
  if( p ){
    sqlite3StrAccumInit(p, 0, 0, 0,
            db ? db->aLimit[SQLITE_LIMIT_LENGTH] : SQLITE_MAX_LENGTH);
  }else{
    p = &sqlite3OomStr;
  }
  return p;
}